

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_clearFB(AMColor *color)

{
  ushort uVar1;
  ushort uVar2;
  FTexture *img;
  long lVar3;
  int iVar4;
  int iVar5;
  
  lVar3 = (long)mapback.texnum;
  if ((am_drawmapback.Value != 2) || ((am_customcolors.Value && (AMMod.defined)))) {
    if (am_drawmapback.Value == 0 || lVar3 < 1) goto LAB_00364755;
  }
  else if ((am_drawmapback.Value == 0 || lVar3 < 1) || am_colorset.Value != 3) {
LAB_00364755:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,0,0,(ulong)(uint)f_w,(ulong)(uint)f_h,(ulong)(uint)color->Index,
               (ulong)color->RGB);
    return;
  }
  if (((uint)mapback.texnum < TexMan.Textures.Count) &&
     (img = TexMan.Textures.Array[lVar3].Texture, img != (FTexture *)0x0)) {
    uVar1 = img->Width;
    uVar2 = img->Height;
    for (iVar5 = (int)mapystart; iVar5 < f_h; iVar5 = iVar5 + (uint)uVar2) {
      for (iVar4 = (int)mapxstart; iVar4 < f_w; iVar4 = iVar4 + (uint)uVar1) {
        DCanvas::DrawTexture
                  ((DCanvas *)screen,img,(double)iVar4,(double)iVar5,0x400013a2,(ulong)(uint)f_h,
                   0x4000139b,0,0x4000139c,0,0);
      }
    }
  }
  return;
}

Assistant:

void setInvalid()
	{
		Index = -1;
		RGB = -1;
	}